

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalTranslator.cpp
# Opt level: O1

void __thiscall UnitTest::SignalTranslator::SignalTranslator(SignalTranslator *this)

{
  sigaction action;
  sigaction local_a8;
  
  this->m_oldJumpTarget = s_jumpTarget->m_currentJumpTarget;
  local_a8.sa_flags = 0;
  local_a8.__sigaction_handler.sa_handler = anon_unknown_1::SignalHandler;
  s_jumpTarget = this;
  sigemptyset(&local_a8.sa_mask);
  sigaction(0xb,&local_a8,(sigaction *)&this->m_old_SIGSEGV_action);
  sigaction(8,&local_a8,(sigaction *)&this->m_old_SIGFPE_action);
  sigaction(5,&local_a8,(sigaction *)&this->m_old_SIGTRAP_action);
  sigaction(7,&local_a8,(sigaction *)&this->m_old_SIGBUS_action);
  sigaction(4,&local_a8,(sigaction *)&this->m_old_SIGBUS_action);
  return;
}

Assistant:

SignalTranslator::SignalTranslator()
{
    m_oldJumpTarget = s_jumpTarget;
    s_jumpTarget = &m_currentJumpTarget;

    struct sigaction action;
    action.sa_flags = 0;
    action.sa_handler = SignalHandler;
    sigemptyset( &action.sa_mask );

    sigaction( SIGSEGV, &action, &m_old_SIGSEGV_action );
    sigaction( SIGFPE , &action, &m_old_SIGFPE_action  );
    sigaction( SIGTRAP, &action, &m_old_SIGTRAP_action );
    sigaction( SIGBUS , &action, &m_old_SIGBUS_action  );
    sigaction( SIGILL , &action, &m_old_SIGBUS_action  );
}